

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_reservestack(HSQUIRRELVM v,SQInteger nsize)

{
  SQUnsignedInteger SVar1;
  SQRESULT SVar2;
  SQObjectPtr *fill;
  long lVar3;
  sqvector<SQObjectPtr> *this;
  long in_RSI;
  long in_RDI;
  sqvector<SQObjectPtr> *this_00;
  SQChar *in_stack_ffffffffffffff98;
  HSQUIRRELVM in_stack_ffffffffffffffa0;
  SQObjectPtr local_28;
  long local_18;
  long local_10;
  
  lVar3 = *(long *)(in_RDI + 0x48);
  local_18 = in_RSI;
  local_10 = in_RDI;
  SVar1 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 0x30));
  if (SVar1 < (ulong)(lVar3 + in_RSI)) {
    if (*(long *)(local_10 + 0x128) != 0) {
      SVar2 = sq_throwerror(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      return SVar2;
    }
    this_00 = (sqvector<SQObjectPtr> *)(local_10 + 0x30);
    fill = (SQObjectPtr *)sqvector<SQObjectPtr>::size(this_00);
    lVar3 = *(long *)(local_10 + 0x48) + local_18;
    SVar1 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(local_10 + 0x30));
    this = (sqvector<SQObjectPtr> *)((long)fill + (lVar3 - SVar1));
    SQObjectPtr::SQObjectPtr(&local_28);
    sqvector<SQObjectPtr>::resize(this,(SQUnsignedInteger)this_00,fill);
    SQObjectPtr::~SQObjectPtr(fill);
  }
  return 0;
}

Assistant:

SQRESULT sq_reservestack(HSQUIRRELVM v,SQInteger nsize)
{
    if (((SQUnsignedInteger)v->_top + nsize) > v->_stack.size()) {
        if(v->_nmetamethodscall) {
            return sq_throwerror(v,_SC("cannot resize stack while in a metamethod"));
        }
        v->_stack.resize(v->_stack.size() + ((v->_top + nsize) - v->_stack.size()));
    }
    return SQ_OK;
}